

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLDateTime::parseDuration(XMLDateTime *this)

{
  XMLSize_t XVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  SchemaDateTimeException *this_00;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  XMLCh *pXVar10;
  uint uVar11;
  bool bVar12;
  double dVar13;
  
  pXVar10 = this->fBuffer;
  if ((pXVar10 == (XMLCh *)0x0) || (*pXVar10 == L'\0')) {
    this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    pXVar10 = this->fBuffer;
    if (pXVar10 == (XMLCh *)0x0) {
      pXVar10 = L"";
    }
    SchemaDateTimeException::SchemaDateTimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x36e,DateTime_dur_invalid,pXVar10,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
  }
  else {
    this->fStart = 1;
    if (*pXVar10 == L'-') {
      this->fStart = 2;
      if (pXVar10[1] != L'P') {
        this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
        SchemaDateTimeException::SchemaDateTimeException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                   ,899,DateTime_dur_noP,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   this->fMemoryManager);
        goto LAB_00255476;
      }
    }
    else if (*pXVar10 != L'P') {
      this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
      SchemaDateTimeException::SchemaDateTimeException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                 ,0x379,DateTime_dur_Start_dashP,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0,this->fMemoryManager);
      goto LAB_00255476;
    }
    bVar12 = *pXVar10 == L'-';
    this->fValue[7] = bVar12 + 1 + (uint)bVar12;
    uVar7 = this->fStart;
    uVar6 = this->fEnd;
    iVar5 = -1;
    uVar8 = 0xffffffff;
    uVar9 = uVar7;
    if (uVar7 < uVar6) {
      do {
        if (pXVar10[uVar9] == L'-') {
          if ((int)uVar9 != -1) {
            this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
            SchemaDateTimeException::SchemaDateTimeException
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                       ,0x397,DateTime_dur_DashNotFirst,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,
                       (XMLCh *)0x0,this->fMemoryManager);
            goto LAB_00255476;
          }
          break;
        }
        uVar9 = uVar9 + 1;
      } while (uVar6 != uVar9);
      uVar8 = 0xffffffff;
      uVar9 = uVar7;
      if (uVar7 < uVar6) {
        do {
          uVar8 = uVar9;
          if (pXVar10[uVar8] == L'T') goto LAB_00254fec;
          uVar9 = uVar8 + 1;
        } while (uVar6 != uVar8 + 1);
        uVar8 = 0xffffffff;
      }
    }
LAB_00254fec:
    iVar2 = (int)uVar6;
    if ((int)uVar8 != -1) {
      iVar2 = (int)uVar8;
    }
    uVar9 = (ulong)iVar2;
    uVar6 = uVar7;
    if (uVar7 < uVar9) {
      do {
        if (pXVar10[uVar6] == L'Y') {
          iVar5 = (int)uVar6;
          break;
        }
        uVar6 = uVar6 + 1;
      } while (uVar9 != uVar6);
    }
    uVar11 = -(uint)bVar12 | 1;
    if (iVar5 != -1) {
      iVar2 = parseInt(this,uVar7,(long)iVar5);
      this->fValue[0] = iVar2 * uVar11;
      this->fStart = (long)(iVar5 + 1);
    }
    uVar7 = this->fStart;
    iVar2 = -1;
    if (uVar7 < uVar9) {
      uVar6 = uVar7;
      do {
        if (this->fBuffer[uVar6] == L'M') {
          iVar2 = (int)uVar6;
          break;
        }
        uVar6 = uVar6 + 1;
      } while (uVar9 != uVar6);
    }
    if (iVar2 != -1) {
      iVar3 = parseInt(this,uVar7,(long)iVar2);
      this->fValue[1] = iVar3 * uVar11;
      this->fStart = (long)(iVar2 + 1);
    }
    uVar7 = this->fStart;
    iVar3 = -1;
    if (uVar7 < uVar9) {
      uVar6 = uVar7;
      do {
        if (this->fBuffer[uVar6] == L'D') {
          iVar3 = (int)uVar6;
          break;
        }
        uVar6 = uVar6 + 1;
      } while (uVar9 != uVar6);
    }
    if (iVar3 != -1) {
      iVar4 = parseInt(this,uVar7,(long)iVar3);
      this->fValue[2] = iVar4 * uVar11;
      this->fStart = (long)(iVar3 + 1);
    }
    bVar12 = iVar3 != -1 || (iVar2 != -1 || iVar5 != -1);
    uVar7 = this->fStart;
    uVar6 = this->fEnd;
    if (uVar7 == uVar6 || uVar6 != uVar9) {
      if (uVar6 != uVar9) {
        uVar9 = uVar7 + 1;
        this->fStart = uVar9;
        iVar5 = -1;
        if (uVar9 < uVar6) {
          do {
            if (this->fBuffer[uVar7 + 1] == L'H') {
              iVar5 = (int)uVar7 + 1;
              break;
            }
            uVar7 = uVar7 + 1;
          } while (uVar6 - 1 != uVar7);
        }
        if (iVar5 != -1) {
          iVar2 = parseInt(this,uVar9,(long)iVar5);
          this->fValue[3] = iVar2 * uVar11;
          this->fStart = (long)(iVar5 + 1);
        }
        uVar7 = this->fStart;
        iVar2 = -1;
        if (uVar7 < this->fEnd) {
          uVar6 = uVar7;
          do {
            if (this->fBuffer[uVar6] == L'M') {
              iVar2 = (int)uVar6;
              break;
            }
            uVar6 = uVar6 + 1;
          } while (this->fEnd != uVar6);
        }
        if (iVar2 != -1) {
          iVar3 = parseInt(this,uVar7,(long)iVar2);
          this->fValue[4] = iVar3 * uVar11;
          this->fStart = (long)(iVar2 + 1);
        }
        bVar12 = iVar2 != -1 || (iVar5 != -1 || bVar12);
        uVar7 = this->fStart;
        iVar5 = -1;
        if (uVar7 < this->fEnd) {
          uVar6 = uVar7;
          do {
            if (this->fBuffer[uVar6] == L'S') {
              iVar5 = (int)uVar6;
              break;
            }
            uVar6 = uVar6 + 1;
          } while (this->fEnd != uVar6);
        }
        if (iVar5 != -1) {
          uVar6 = (ulong)iVar5;
          iVar2 = -1;
          if (uVar7 < uVar6) {
            uVar9 = uVar7;
            do {
              if (this->fBuffer[uVar9] == L'.') {
                iVar2 = (int)uVar9;
                break;
              }
              uVar9 = uVar9 + 1;
            } while (uVar6 != uVar9);
          }
          if (iVar2 == -1) {
            iVar2 = parseInt(this,uVar7,uVar6);
            this->fValue[5] = iVar2 * uVar11;
          }
          else {
            if (iVar2 + 1 == iVar5) {
              this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
              SchemaDateTimeException::SchemaDateTimeException
                        (this_00,
                         "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                         ,0x3f6,DateTime_dur_inv_seconds,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,
                         (XMLCh *)0x0,this->fMemoryManager);
              goto LAB_00255476;
            }
            iVar3 = parseInt(this,uVar7,(long)iVar2);
            this->fValue[5] = iVar3 * uVar11;
            dVar13 = parseMiliSecond(this,(long)(iVar2 + 1),uVar6);
            this->fMilliSecond = dVar13 * (double)(int)uVar11;
          }
          this->fStart = (long)(iVar5 + 1);
          bVar12 = true;
        }
        XVar1 = this->fStart;
        if ((XVar1 != this->fEnd) || (this->fStart = XVar1 - 1, this->fBuffer[XVar1 - 1] == L'T')) {
          this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
          SchemaDateTimeException::SchemaDateTimeException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                     ,0x40d,DateTime_dur_NoTimeAfterT,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00255476;
        }
      }
      if (bVar12) {
        return;
      }
      this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
      SchemaDateTimeException::SchemaDateTimeException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                 ,0x416,DateTime_dur_NoElementAtAll,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0,this->fMemoryManager);
    }
    else {
      this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
      SchemaDateTimeException::SchemaDateTimeException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                 ,0x3c5,DateTime_dur_inv_b4T,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                 this->fMemoryManager);
    }
  }
LAB_00255476:
  __cxa_throw(this_00,&SchemaDateTimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLDateTime::parseDuration()
{
    if (!initParser())
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_invalid
                , fBuffer ? fBuffer : XMLUni::fgZeroLenString
                , fMemoryManager);

    // must start with '-' or 'P'
    //
    XMLCh c = fBuffer[fStart++];
    if ( (c != DURATION_STARTER) &&
         (c != chDash)            )
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_Start_dashP
                , fBuffer
                , fMemoryManager);
    }

    // 'P' must ALWAYS be present in either case
    if ( (c == chDash) &&
         (fBuffer[fStart++]!= DURATION_STARTER ))
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_noP
                , fBuffer
                , fMemoryManager);
    }

    // java code
    //date[utc]=(c=='-')?'-':0;
    //fValue[utc] = UTC_STD;
    fValue[utc] = (fBuffer[0] == chDash? UTC_NEG : UTC_STD);

    int negate = ( fBuffer[0] == chDash ? -1 : 1);

    //
    // No negative value is allowed after 'P'
    //
    // eg P-1234, invalid
    //
    if (indexOf(fStart, fEnd, chDash) != NOT_FOUND)
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_DashNotFirst
                , fBuffer
                , fMemoryManager);
    }

    //at least one number and designator must be seen after P
    bool designator = false;

    int endDate = indexOf(fStart, fEnd, DATETIME_SEPARATOR);
    if ( endDate == NOT_FOUND )
    {
        endDate = (int)fEnd;  // 'T' absent
    }

    //find 'Y'
    int end = indexOf(fStart, endDate, DURATION_Y);
    if ( end != NOT_FOUND )
    {
        //scan year
        fValue[CentYear] = negate * parseInt(fStart, end);
        fStart = end+1;
        designator = true;
    }

    end = indexOf(fStart, endDate, DURATION_M);
    if ( end != NOT_FOUND )
    {
        //scan month
        fValue[Month] = negate * parseInt(fStart, end);
        fStart = end+1;
        designator = true;
    }

    end = indexOf(fStart, endDate, DURATION_D);
    if ( end != NOT_FOUND )
    {
        //scan day
        fValue[Day] = negate * parseInt(fStart,end);
        fStart = end+1;
        designator = true;
    }

    if ( (fEnd == XMLSize_t (endDate)) &&   // 'T' absent
         (fStart != fEnd)   )   // something after Day
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_inv_b4T
                , fBuffer
                , fMemoryManager);
    }

    if ( fEnd != XMLSize_t (endDate) ) // 'T' present
    {
        //scan hours, minutes, seconds
        //

        // skip 'T' first
        end = indexOf(++fStart, fEnd, DURATION_H);
        if ( end != NOT_FOUND )
        {
            //scan hours
            fValue[Hour] = negate * parseInt(fStart, end);
            fStart = end+1;
            designator = true;
        }

        end = indexOf(fStart, fEnd, DURATION_M);
        if ( end != NOT_FOUND )
        {
            //scan min
            fValue[Minute] = negate * parseInt(fStart, end);
            fStart = end+1;
            designator = true;
        }

        end = indexOf(fStart, fEnd, DURATION_S);
        if ( end != NOT_FOUND )
        {
            //scan seconds
            int mlsec = indexOf (fStart, end, MILISECOND_SEPARATOR);

            /***
             * Schema Errata: E2-23
             * at least one digit must follow the decimal point if it appears.
             * That is, the value of the seconds component must conform
             * to the following pattern: [0-9]+(.[0-9]+)?
             */
            if ( mlsec != NOT_FOUND )
            {
                /***
                 * make usure there is something after the '.' and before the end.
                 */
                if ( mlsec+1 == end )
                {
                    ThrowXMLwithMemMgr1(SchemaDateTimeException
                            , XMLExcepts::DateTime_dur_inv_seconds
                            , fBuffer
                            , fMemoryManager);
                }

                fValue[Second]     = negate * parseInt(fStart, mlsec);
                fMilliSecond        = negate * parseMiliSecond(mlsec+1, end);
            }
            else
            {
                fValue[Second] = negate * parseInt(fStart,end);
            }

            fStart = end+1;
            designator = true;
        }

        // no additional data should appear after last item
        // P1Y1M1DT is illigal value as well
        if ( (fStart != fEnd) ||
              fBuffer[--fStart] == DATETIME_SEPARATOR )
        {
            ThrowXMLwithMemMgr1(SchemaDateTimeException
                    , XMLExcepts::DateTime_dur_NoTimeAfterT
                    , fBuffer
                    , fMemoryManager);
        }
    }

    if ( !designator )
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_NoElementAtAll
                , fBuffer
                , fMemoryManager);
    }

}